

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gradient.c
# Opt level: O2

void grd_worker(job_t *job,uint32_t id,uint32_t cnt,grd_st_t *grd_st)

{
  dat_t *pdVar1;
  _Bool _Var2;
  ulong in_RAX;
  ulong uVar3;
  uint32_t pos;
  uint32_t count;
  undefined8 local_38;
  
  pdVar1 = grd_st->mdl->train;
  grd_st->lloss = 0.0;
  local_38 = in_RAX;
  do {
    _Var2 = mth_getjob(job,(uint32_t *)((long)&local_38 + 4),(uint32_t *)&local_38);
    if (!_Var2) {
      return;
    }
    uVar3 = local_38 & 0xffffffff;
    while( true ) {
      if (uit_stop != false) {
        return;
      }
      if (local_38._4_4_ + (uint32_t)local_38 <= uVar3) break;
      grd_dospl(grd_st,pdVar1->seq[uVar3]);
      uVar3 = uVar3 + 1;
    }
  } while( true );
}

Assistant:

static
void grd_worker(job_t *job, uint32_t id, uint32_t cnt, grd_st_t *grd_st) {
	unused(id && cnt);
	mdl_t *mdl = grd_st->mdl;
	const dat_t *dat = mdl->train;
	// We first cleanup the gradient and value as our parent don't do it (it
	// is better to do this also in parallel)
	grd_st->lloss = 0.0;
#ifdef ATM_ANSI
	const uint64_t F = mdl->nftr;
	for (uint64_t f = 0; f < F; f++)
		grd_st->g[f] = 0.0;
#endif
	// Now all is ready, we can process our sequences and accumulate the
	// gradient and inverse log-likelihood
	uint32_t count, pos;
	while (mth_getjob(job, &count, &pos)) {
		for (uint32_t s = pos; !uit_stop && s < pos + count; s++)
			grd_dospl(grd_st, dat->seq[s]);
		if (uit_stop)
			break;
	}
}